

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

int explist(LexState *ls,expdesc *v)

{
  int iVar1;
  
  subexpr(ls,v,0);
  iVar1 = 1;
  while ((ls->t).token == 0x2c) {
    luaX_next(ls);
    luaK_exp2nextreg(ls->fs,v);
    subexpr(ls,v,0);
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

static int explist(LexState *ls, expdesc *v) {
    /* explist -> expr { ',' expr } */
    int n = 1;  /* at least one expression */
    expr(ls, v);
    while (testnext(ls, ',')) {
        luaK_exp2nextreg(ls->fs, v);
        expr(ls, v);
        n++;
    }
    return n;
}